

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FilterInfo.cpp
# Opt level: O0

void __thiscall helics::FilterInfo::removeTarget(FilterInfo *this,GlobalHandle targetId)

{
  bool bVar1;
  reference this_00;
  undefined8 in_RSI;
  GlobalHandle *in_RDI;
  EptInformation *dim;
  iterator __end3_1;
  iterator __begin3_1;
  vector<helics::EptInformation,_std::allocator<helics::EptInformation>_> *__range3_1;
  iterator di;
  EptInformation *sim;
  iterator __end3;
  iterator __begin3;
  vector<helics::EptInformation,_std::allocator<helics::EptInformation>_> *__range3;
  iterator si;
  vector<helics::EptInformation,_std::allocator<helics::EptInformation>_> *in_stack_ffffffffffffff48
  ;
  GlobalHandle *this_01;
  GlobalHandle *in_stack_ffffffffffffff50;
  GlobalHandle in_stack_ffffffffffffff60;
  const_iterator in_stack_ffffffffffffff68;
  __normal_iterator<helics::EptInformation_*,_std::vector<helics::EptInformation,_std::allocator<helics::EptInformation>_>_>
  local_90;
  GlobalHandle *local_88;
  EptInformation *local_80;
  undefined8 local_70;
  EptInformation *local_68;
  __normal_iterator<helics::EptInformation_*,_std::vector<helics::EptInformation,_std::allocator<helics::EptInformation>_>_>
  local_60;
  reference local_58;
  EptInformation *local_50;
  __normal_iterator<helics::EptInformation_*,_std::vector<helics::EptInformation,_std::allocator<helics::EptInformation>_>_>
  local_48;
  GlobalHandle *local_40;
  EptInformation *local_38;
  undefined8 local_28;
  EptInformation *local_20;
  __normal_iterator<helics::EptInformation_*,_std::vector<helics::EptInformation,_std::allocator<helics::EptInformation>_>_>
  local_18 [2];
  undefined8 local_8;
  
  local_8 = in_RSI;
  local_18[0]._M_current =
       (EptInformation *)
       std::vector<helics::EptInformation,_std::allocator<helics::EptInformation>_>::begin
                 (in_stack_ffffffffffffff48);
  do {
    local_20 = (EptInformation *)
               std::vector<helics::EptInformation,_std::allocator<helics::EptInformation>_>::end
                         (in_stack_ffffffffffffff48);
    bVar1 = __gnu_cxx::
            operator==<helics::EptInformation_*,_std::vector<helics::EptInformation,_std::allocator<helics::EptInformation>_>_>
                      ((__normal_iterator<helics::EptInformation_*,_std::vector<helics::EptInformation,_std::allocator<helics::EptInformation>_>_>
                        *)in_stack_ffffffffffffff50,
                       (__normal_iterator<helics::EptInformation_*,_std::vector<helics::EptInformation,_std::allocator<helics::EptInformation>_>_>
                        *)in_stack_ffffffffffffff48);
    if (((bVar1 ^ 0xffU) & 1) == 0) goto LAB_005cfcbf;
    __gnu_cxx::
    __normal_iterator<helics::EptInformation_*,_std::vector<helics::EptInformation,_std::allocator<helics::EptInformation>_>_>
    ::operator->(local_18);
    local_28 = local_8;
    bVar1 = GlobalHandle::operator==(in_RDI,in_stack_ffffffffffffff60);
  } while (!bVar1);
  in_stack_ffffffffffffff50 = in_RDI + 0x16;
  __gnu_cxx::
  __normal_iterator<helics::EptInformation_const*,std::vector<helics::EptInformation,std::allocator<helics::EptInformation>>>
  ::__normal_iterator<helics::EptInformation*>
            ((__normal_iterator<const_helics::EptInformation_*,_std::vector<helics::EptInformation,_std::allocator<helics::EptInformation>_>_>
              *)in_stack_ffffffffffffff50,
             (__normal_iterator<helics::EptInformation_*,_std::vector<helics::EptInformation,_std::allocator<helics::EptInformation>_>_>
              *)in_stack_ffffffffffffff48);
  local_38 = (EptInformation *)
             std::vector<helics::EptInformation,_std::allocator<helics::EptInformation>_>::erase
                       ((vector<helics::EptInformation,_std::allocator<helics::EptInformation>_> *)
                        in_stack_ffffffffffffff60,in_stack_ffffffffffffff68);
  std::vector<helics::GlobalHandle,_std::allocator<helics::GlobalHandle>_>::clear
            ((vector<helics::GlobalHandle,_std::allocator<helics::GlobalHandle>_> *)0x5cfc34);
  local_40 = in_RDI + 0x16;
  local_48._M_current =
       (EptInformation *)
       std::vector<helics::EptInformation,_std::allocator<helics::EptInformation>_>::begin
                 (in_stack_ffffffffffffff48);
  local_50 = (EptInformation *)
             std::vector<helics::EptInformation,_std::allocator<helics::EptInformation>_>::end
                       (in_stack_ffffffffffffff48);
  while (bVar1 = __gnu_cxx::
                 operator==<helics::EptInformation_*,_std::vector<helics::EptInformation,_std::allocator<helics::EptInformation>_>_>
                           ((__normal_iterator<helics::EptInformation_*,_std::vector<helics::EptInformation,_std::allocator<helics::EptInformation>_>_>
                             *)in_stack_ffffffffffffff50,
                            (__normal_iterator<helics::EptInformation_*,_std::vector<helics::EptInformation,_std::allocator<helics::EptInformation>_>_>
                             *)in_stack_ffffffffffffff48), ((bVar1 ^ 0xffU) & 1) != 0) {
    local_58 = __gnu_cxx::
               __normal_iterator<helics::EptInformation_*,_std::vector<helics::EptInformation,_std::allocator<helics::EptInformation>_>_>
               ::operator*(&local_48);
    std::vector<helics::GlobalHandle,std::allocator<helics::GlobalHandle>>::
    emplace_back<helics::GlobalHandle_const&>
              ((vector<helics::GlobalHandle,_std::allocator<helics::GlobalHandle>_> *)
               in_stack_ffffffffffffff60,in_RDI);
    __gnu_cxx::
    __normal_iterator<helics::EptInformation_*,_std::vector<helics::EptInformation,_std::allocator<helics::EptInformation>_>_>
    ::operator++(&local_48);
  }
  CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::clear
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x5cfcb8);
LAB_005cfcbf:
  local_60._M_current =
       (EptInformation *)
       std::vector<helics::EptInformation,_std::allocator<helics::EptInformation>_>::begin
                 (in_stack_ffffffffffffff48);
  do {
    local_68 = (EptInformation *)
               std::vector<helics::EptInformation,_std::allocator<helics::EptInformation>_>::end
                         (in_stack_ffffffffffffff48);
    bVar1 = __gnu_cxx::
            operator==<helics::EptInformation_*,_std::vector<helics::EptInformation,_std::allocator<helics::EptInformation>_>_>
                      ((__normal_iterator<helics::EptInformation_*,_std::vector<helics::EptInformation,_std::allocator<helics::EptInformation>_>_>
                        *)in_stack_ffffffffffffff50,
                       (__normal_iterator<helics::EptInformation_*,_std::vector<helics::EptInformation,_std::allocator<helics::EptInformation>_>_>
                        *)in_stack_ffffffffffffff48);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      return;
    }
    __gnu_cxx::
    __normal_iterator<helics::EptInformation_*,_std::vector<helics::EptInformation,_std::allocator<helics::EptInformation>_>_>
    ::operator->(&local_60);
    local_70 = local_8;
    bVar1 = GlobalHandle::operator==(in_RDI,in_stack_ffffffffffffff60);
  } while (!bVar1);
  this_01 = in_RDI + 0x19;
  __gnu_cxx::
  __normal_iterator<helics::EptInformation_const*,std::vector<helics::EptInformation,std::allocator<helics::EptInformation>>>
  ::__normal_iterator<helics::EptInformation*>
            ((__normal_iterator<const_helics::EptInformation_*,_std::vector<helics::EptInformation,_std::allocator<helics::EptInformation>_>_>
              *)in_stack_ffffffffffffff50,
             (__normal_iterator<helics::EptInformation_*,_std::vector<helics::EptInformation,_std::allocator<helics::EptInformation>_>_>
              *)this_01);
  local_80 = (EptInformation *)
             std::vector<helics::EptInformation,_std::allocator<helics::EptInformation>_>::erase
                       ((vector<helics::EptInformation,_std::allocator<helics::EptInformation>_> *)
                        in_stack_ffffffffffffff60,in_stack_ffffffffffffff68);
  std::vector<helics::GlobalHandle,_std::allocator<helics::GlobalHandle>_>::clear
            ((vector<helics::GlobalHandle,_std::allocator<helics::GlobalHandle>_> *)0x5cfd77);
  local_88 = in_RDI + 0x19;
  local_90._M_current =
       (EptInformation *)
       std::vector<helics::EptInformation,_std::allocator<helics::EptInformation>_>::begin
                 ((vector<helics::EptInformation,_std::allocator<helics::EptInformation>_> *)this_01
                 );
  std::vector<helics::EptInformation,_std::allocator<helics::EptInformation>_>::end
            ((vector<helics::EptInformation,_std::allocator<helics::EptInformation>_> *)this_01);
  while (bVar1 = __gnu_cxx::
                 operator==<helics::EptInformation_*,_std::vector<helics::EptInformation,_std::allocator<helics::EptInformation>_>_>
                           ((__normal_iterator<helics::EptInformation_*,_std::vector<helics::EptInformation,_std::allocator<helics::EptInformation>_>_>
                             *)in_stack_ffffffffffffff50,
                            (__normal_iterator<helics::EptInformation_*,_std::vector<helics::EptInformation,_std::allocator<helics::EptInformation>_>_>
                             *)this_01), ((bVar1 ^ 0xffU) & 1) != 0) {
    this_00 = __gnu_cxx::
              __normal_iterator<helics::EptInformation_*,_std::vector<helics::EptInformation,_std::allocator<helics::EptInformation>_>_>
              ::operator*(&local_90);
    std::vector<helics::GlobalHandle,std::allocator<helics::GlobalHandle>>::
    emplace_back<helics::GlobalHandle_const&>
              ((vector<helics::GlobalHandle,_std::allocator<helics::GlobalHandle>_> *)this_00,in_RDI
              );
    __gnu_cxx::
    __normal_iterator<helics::EptInformation_*,_std::vector<helics::EptInformation,_std::allocator<helics::EptInformation>_>_>
    ::operator++(&local_90);
  }
  CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::clear
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x5cfdfe);
  return;
}

Assistant:

void FilterInfo::removeTarget(GlobalHandle targetId)
{
    auto si = sourceEndpoints.begin();
    while (si != sourceEndpoints.end()) {
        if (si->id == targetId) {
            sourceEndpoints.erase(si);
            sourceTargets.clear();
            for (const auto& sim : sourceEndpoints) {
                sourceTargets.emplace_back(sim.id);
            }
            sourceEpts.clear();
            break;
        }
    }
    auto di = destEndpoints.begin();
    while (di != destEndpoints.end()) {
        if (di->id == targetId) {
            destEndpoints.erase(si);
            destTargets.clear();
            for (const auto& dim : destEndpoints) {
                destTargets.emplace_back(dim.id);
            }
            destEpts.clear();
            break;
        }
    }
}